

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O1

void __thiscall
fizplex::LPTest_GetValueWhenNoValueWasAddedIsZero_Test::TestBody
          (LPTest_GetValueWhenNoValueWasAddedIsZero_Test *this)

{
  bool bVar1;
  char *message;
  double rhs_value;
  AssertionResult gtest_ar;
  LP lp;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  internal local_a0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  LP local_90;
  
  LP::LP(&local_90);
  LP::add_column(&local_90,Bounded,0.0,5.0,0.0);
  LP::add_row(&local_90,Range,3.0,15.0);
  rhs_value = LP::get_value(&local_90,0,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_a0,"0.0","lp.get_value(0, 0)",0.0,rhs_value);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_98.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x70,message);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
      local_b0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_90.rows.super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.rows.
                    super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.rows.
                          super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.rows.
                          super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.cols.super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.cols.
                    super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.cols.
                          super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.cols.
                          super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(local_90.c.vals._M_data);
  operator_delete(local_90.b.vals._M_data);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)&local_90);
  return;
}

Assistant:

TEST(LPTest, GetValueWhenNoValueWasAddedIsZero) {
  LP lp;
  lp.add_column(ColType::Bounded, 0, 5);
  lp.add_row(RowType::Range, 3, 15);
  EXPECT_DOUBLE_EQ(0.0, lp.get_value(0, 0));
}